

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.h
# Opt level: O0

bool NextString<settings_tests::MergeTestingSetup::Action,3ul>
               (Action (*string) [3],Action min_char,Action max_char)

{
  int iVar1;
  long lVar2;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  long in_FS_OFFSET;
  bool has_next;
  Action *elem;
  Action *__end0;
  Action *__begin0;
  Action (*__range1) [3];
  int local_48;
  int *local_30;
  bool local_9;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = in_RDI;
  do {
    if (local_30 == in_RDI + 3) {
      local_9 = false;
LAB_00ad9574:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
        __stack_chk_fail();
      }
      return local_9;
    }
    iVar1 = *local_30;
    local_48 = in_ESI;
    if ((in_ESI <= *local_30) && (*local_30 < in_EDX)) {
      local_48 = *local_30 + 1;
    }
    *local_30 = local_48;
    if (iVar1 != in_EDX) {
      local_9 = true;
      goto LAB_00ad9574;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

bool NextString(CharType (&string)[StringLength], CharType min_char, CharType max_char)
{
    for (CharType& elem : string) {
        bool has_next = elem != max_char;
        elem = elem < min_char || elem >= max_char ? min_char : CharType(elem + 1);
        if (has_next) return true;
    }
    return false;
}